

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtcm(fitsfile *gfptr,int cmopt,int *status)

{
  int iVar1;
  int *in_RDX;
  int in_ESI;
  bool bVar2;
  fitsfile *mfptr;
  char comment [73];
  char keyvalue [71];
  long nmembers;
  long i;
  int *in_stack_00001950;
  fitsfile **in_stack_00001958;
  long in_stack_00001960;
  fitsfile *in_stack_00001968;
  int *in_stack_00001d00;
  int in_stack_00001d0c;
  long in_stack_00001d10;
  fitsfile *in_stack_00001d18;
  int *status_00;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  fitsfile *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffffb8;
  long *in_stack_ffffffffffffffc0;
  fitsfile *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined4 local_4;
  
  status_00 = (int *)0x0;
  if (*in_RDX == 0) {
    if ((in_ESI == 1) || (in_ESI == 0xb)) {
      iVar1 = ffgtnm(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      *in_RDX = iVar1;
      local_28 = 1;
      while( true ) {
        bVar2 = false;
        if (local_28 < 1) {
          bVar2 = *in_RDX == 0;
        }
        if (!bVar2) break;
        iVar1 = ffgmop(in_stack_00001968,in_stack_00001960,in_stack_00001958,in_stack_00001950);
        *in_RDX = iVar1;
        if (*in_RDX == 0) {
          iVar1 = ffgkys(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68);
          *in_RDX = iVar1;
          if (*in_RDX == 0xca) {
            *in_RDX = 0;
          }
          else {
            prepare_keyvalue((char *)status_00);
            if (*in_RDX == 0) {
              iVar1 = fits_strcasecmp((char *)in_stack_ffffffffffffff38,(char *)status_00);
              if (iVar1 == 0) {
                iVar1 = ffgtmg(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
                *in_RDX = iVar1;
                iVar1 = ffclos(in_stack_ffffffffffffff38,status_00);
                *in_RDX = iVar1;
                status_00 = (int *)0x0;
                if (in_ESI == 1) {
                  iVar1 = ffgmrm(in_stack_00001d18,in_stack_00001d10,in_stack_00001d0c,
                                 in_stack_00001d00);
                  *in_RDX = iVar1;
                }
                else {
                  iVar1 = ffgmrm(in_stack_00001d18,in_stack_00001d10,in_stack_00001d0c,
                                 in_stack_00001d00);
                  *in_RDX = iVar1;
                }
              }
              else {
                iVar1 = ffclos(in_stack_ffffffffffffff38,status_00);
                *in_RDX = iVar1;
                status_00 = (int *)0x0;
              }
            }
          }
        }
        local_28 = local_28 + 1;
      }
    }
    else {
      *in_RDX = 0x15b;
      ffpmsg((char *)0x1d4946);
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgtcm(fitsfile *gfptr,  /* FITS file pointer to grouping table          */
	   int       cmopt,  /* code specifying compact options
				OPT_CMT_MBR      (1) ==> compact only direct 
			                                 members (if groups)
				OPT_CMT_MBR_DEL (11) ==> (1) + delete all 
				                         compacted groups    */
	   int      *status) /* return status code                           */
    
/*
  "Compact" a group pointed to by the FITS file pointer gfptr. This 
  is achieved by flattening the tree structure of a group and its 
  (grouping table) members. All members HDUs of a grouping table which is 
  itself a member of the grouping table gfptr are added to gfptr. Optionally,
  the grouping tables which are "compacted" are deleted. If the grouping 
  table contains no members that are themselves grouping tables then this 
  function performs a NOOP.
*/

{
  long i;
  long nmembers = 0;

  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];

  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      if(cmopt != OPT_CMT_MBR && cmopt != OPT_CMT_MBR_DEL)
	{
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value for cmopt parameter specified (ffgtcm)");
	  continue;
	}

      /* reteive the number of grouping table members */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      /*
	loop over all the grouping table members; if the member is a 
	grouping table then merge its members with the parent grouping 
	table 
      */

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(gfptr,i,&mfptr,status);

	  if(*status != 0) continue;

	  *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,comment,status);

	  /* if no EXTNAME keyword then cannot be a grouping table */

	  if(*status == KEY_NO_EXIST) 
	    {
	      *status = 0;
	      continue;
	    }
	  prepare_keyvalue(keyvalue);

	  if(*status != 0) continue;

	  /* if EXTNAME == "GROUPING" then process member as grouping table */

	  if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	    {
	      /* merge the member (grouping table) into the grouping table */

	      *status = fits_merge_groups(mfptr,gfptr,OPT_MRG_COPY,status);

	      *status = fits_close_file(mfptr,status);
	      mfptr = NULL;

	      /* 
		 remove the member from the grouping table now that all of
		 its members have been transferred; if cmopt is set to
		 OPT_CMT_MBR_DEL then remove and delete the member
	      */

	      if(cmopt == OPT_CMT_MBR)
		*status = fits_remove_member(gfptr,i,OPT_RM_ENTRY,status);
	      else
		*status = fits_remove_member(gfptr,i,OPT_RM_MBR,status);
	    }
	  else
	    {
	      /* not a grouping table; just close the opened member */

	      *status = fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }
	}

    }while(0);

  return(*status);
}